

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall dxil_spv::Converter::Impl::mark_used_value(Impl *this,Value *value)

{
  bool bVar1;
  Value *local_18;
  Value *value_local;
  Impl *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  bVar1 = LLVMBC::isa<LLVMBC::Constant>(value);
  if (!bVar1) {
    std::
    unordered_set<const_LLVMBC::Value_*,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>_>
    ::insert(&this->llvm_used_ssa_values,&local_18);
  }
  return;
}

Assistant:

void Converter::Impl::mark_used_value(const llvm::Value *value)
{
	if (!llvm::isa<llvm::Constant>(value))
	{
		// Technically, we won't be able to eliminate a chain of SSA expressions
		// which are unused this way, but eeeeeeh. DXC really should handle that.
		// This is to deal with odd-ball edge cases where random single SSA instructions
		// were not eliminated for whatever reason.
		llvm_used_ssa_values.insert(value);
	}
}